

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

void Nwk_ManGraphUpdate(Nwk_Grf_t *p,Nwk_Vrt_t *pVertex,Nwk_Vrt_t *pNext)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  Nwk_Vrt_t *pNVar4;
  Nwk_Vrt_t *pNVar5;
  Nwk_Vrt_t *pNVar6;
  uint uVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  Nwk_Vrt_t **ppNVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  
  Nwk_ManGraphListExtract(p,pVertex);
  Nwk_ManGraphListExtract(p,pNext);
  if (0 < pVertex->nEdges) {
    piVar2 = p->pLists2 + 0x10;
    piVar1 = p->pLists1 + 0x10;
    lVar16 = 0;
    do {
      pNVar4 = p->pVerts[(&pVertex[1].Id)[lVar16]];
      if (pNVar4 != pNext) {
        Nwk_ManGraphListExtract(p,pNVar4);
        if ((1 < pNVar4->nEdges) && (0 < pNVar4->nEdges)) {
          lVar15 = 0;
          do {
            pNVar5 = p->pVerts[(&pNVar4[1].Id)[lVar15]];
            if ((pNVar5 != pVertex) && (pNVar5->nEdges < 2)) {
              if (pNVar5->nEdges != 1) {
                __assert_fail("pOther->nEdges == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                              ,0x1df,
                              "void Nwk_ManGraphUpdate(Nwk_Grf_t *, Nwk_Vrt_t *, Nwk_Vrt_t *)");
              }
              Nwk_ManGraphListExtract(p,pNVar5);
              pNVar4->nEdges = pNVar4->nEdges + -1;
              iVar10 = pNVar5->nEdges;
              lVar12 = (long)iVar10;
              if (lVar12 < 1) goto LAB_004e28bc;
              if (iVar10 == 1) {
                ppNVar14 = p->pVerts;
                lVar12 = (long)ppNVar14[pNVar5[1].Id]->nEdges;
                if (lVar12 < 0x10) {
                  piVar9 = p->pLists1 + lVar12;
                  iVar10 = p->pLists1[lVar12];
                }
                else {
                  iVar10 = *piVar1;
                  piVar9 = piVar1;
                }
                if (iVar10 != 0) {
LAB_004e24d5:
                  pNVar6 = ppNVar14[iVar10];
                  pNVar5->iPrev = 0;
                  pNVar5->iNext = pNVar6->Id;
                  pNVar6->iPrev = pNVar5->Id;
                }
              }
              else {
                if (iVar10 < 0x10) {
                  piVar9 = p->pLists2 + lVar12;
                  iVar10 = p->pLists2[lVar12];
                }
                else {
                  iVar10 = *piVar2;
                  piVar9 = piVar2;
                }
                if (iVar10 != 0) {
                  ppNVar14 = p->pVerts;
                  goto LAB_004e24d5;
                }
              }
              *piVar9 = pNVar5->Id;
              pNVar4->nEdges = pNVar4->nEdges + 1;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < pNVar4->nEdges);
        }
        uVar8 = (ulong)pNVar4->nEdges;
        if ((long)uVar8 < 1) goto LAB_004e289d;
        if (pNVar4[1].Id == pVertex->Id) {
          bVar18 = true;
          uVar13 = 0;
        }
        else {
          uVar17 = 0;
          do {
            if (uVar8 - 1 == uVar17) goto LAB_004e289d;
            uVar13 = uVar17 + 1;
            piVar9 = &pNVar4[1].iPrev + uVar17;
            uVar17 = uVar13;
          } while (*piVar9 != pVertex->Id);
          bVar18 = uVar13 < uVar8;
        }
        if (!bVar18) goto LAB_004e289d;
        uVar7 = pNVar4->nEdges - 1;
        pNVar4->nEdges = uVar7;
        if ((int)uVar13 < (int)uVar7) {
          do {
            (&pNVar4[1].Id)[uVar13] = (&pNVar4[1].iPrev)[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar7 != uVar13);
        }
        iVar10 = pNVar4->nEdges;
        if (0 < (long)iVar10) {
          if (iVar10 == 1) {
            ppNVar14 = p->pVerts;
            piVar9 = piVar1;
            if ((long)ppNVar14[pNVar4[1].Id]->nEdges < 0x10) {
              piVar9 = p->pLists1 + ppNVar14[pNVar4[1].Id]->nEdges;
            }
            iVar10 = *piVar9;
            if (iVar10 != 0) {
LAB_004e25d5:
              pNVar5 = ppNVar14[iVar10];
              pNVar4->iPrev = 0;
              pNVar4->iNext = pNVar5->Id;
              pNVar5->iPrev = pNVar4->Id;
            }
          }
          else {
            piVar9 = piVar2;
            if (iVar10 < 0x10) {
              piVar9 = p->pLists2 + iVar10;
            }
            iVar10 = *piVar9;
            if (iVar10 != 0) {
              ppNVar14 = p->pVerts;
              goto LAB_004e25d5;
            }
          }
          *piVar9 = pNVar4->Id;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVertex->nEdges);
  }
  if (0 < pNext->nEdges) {
    piVar2 = p->pLists2 + 0x10;
    piVar1 = p->pLists1 + 0x10;
    lVar16 = 0;
    do {
      pNVar4 = p->pVerts[(&pNext[1].Id)[lVar16]];
      if (pNVar4 != pVertex) {
        Nwk_ManGraphListExtract(p,pNVar4);
        if ((1 < pNVar4->nEdges) && (0 < pNVar4->nEdges)) {
          lVar15 = 0;
          do {
            pNVar5 = p->pVerts[(&pNVar4[1].Id)[lVar15]];
            if ((pNVar5 != pNext) && (pNVar5->nEdges < 2)) {
              if (pNVar5->nEdges != 1) {
                __assert_fail("pOther->nEdges == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                              ,0x1f7,
                              "void Nwk_ManGraphUpdate(Nwk_Grf_t *, Nwk_Vrt_t *, Nwk_Vrt_t *)");
              }
              Nwk_ManGraphListExtract(p,pNVar5);
              pNVar4->nEdges = pNVar4->nEdges + -1;
              iVar10 = pNVar5->nEdges;
              lVar12 = (long)iVar10;
              if (lVar12 < 1) {
LAB_004e28bc:
                __assert_fail("pVertex->nEdges > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                              ,0xd5,"void Nwk_ManGraphListInsert(Nwk_Grf_t *, Nwk_Vrt_t *)");
              }
              if (iVar10 == 1) {
                ppNVar14 = p->pVerts;
                lVar12 = (long)ppNVar14[pNVar5[1].Id]->nEdges;
                if (lVar12 < 0x10) {
                  piVar9 = p->pLists1 + lVar12;
                  iVar10 = p->pLists1[lVar12];
                }
                else {
                  iVar10 = *piVar1;
                  piVar9 = piVar1;
                }
                if (iVar10 != 0) {
LAB_004e2712:
                  pNVar6 = ppNVar14[iVar10];
                  pNVar5->iPrev = 0;
                  pNVar5->iNext = pNVar6->Id;
                  pNVar6->iPrev = pNVar5->Id;
                }
              }
              else {
                if (iVar10 < 0x10) {
                  piVar9 = p->pLists2 + lVar12;
                  iVar10 = p->pLists2[lVar12];
                }
                else {
                  iVar10 = *piVar2;
                  piVar9 = piVar2;
                }
                if (iVar10 != 0) {
                  ppNVar14 = p->pVerts;
                  goto LAB_004e2712;
                }
              }
              *piVar9 = pNVar5->Id;
              pNVar4->nEdges = pNVar4->nEdges + 1;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < pNVar4->nEdges);
        }
        uVar8 = (ulong)pNVar4->nEdges;
        if ((long)uVar8 < 1) {
LAB_004e289d:
          __assert_fail("k < pThis->nEdges",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                        ,0x1bb,"void Nwk_ManGraphVertexRemoveEdge(Nwk_Vrt_t *, Nwk_Vrt_t *)");
        }
        if (pNVar4[1].Id == pNext->Id) {
          bVar18 = true;
          uVar13 = 0;
        }
        else {
          uVar17 = 0;
          do {
            if (uVar8 - 1 == uVar17) goto LAB_004e289d;
            uVar13 = uVar17 + 1;
            piVar9 = &pNVar4[1].iPrev + uVar17;
            uVar17 = uVar13;
          } while (*piVar9 != pNext->Id);
          bVar18 = uVar13 < uVar8;
        }
        if (!bVar18) goto LAB_004e289d;
        uVar7 = pNVar4->nEdges - 1;
        pNVar4->nEdges = uVar7;
        if ((int)uVar13 < (int)uVar7) {
          do {
            (&pNVar4[1].Id)[uVar13] = (&pNVar4[1].iPrev)[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar7 != uVar13);
        }
        iVar10 = pNVar4->nEdges;
        if (0 < (long)iVar10) {
          if (iVar10 == 1) {
            ppNVar14 = p->pVerts;
            piVar9 = piVar1;
            if ((long)ppNVar14[pNVar4[1].Id]->nEdges < 0x10) {
              piVar9 = p->pLists1 + ppNVar14[pNVar4[1].Id]->nEdges;
            }
            iVar10 = *piVar9;
            if (iVar10 != 0) {
LAB_004e2817:
              pNVar5 = ppNVar14[iVar10];
              pNVar4->iPrev = 0;
              pNVar4->iNext = pNVar5->Id;
              pNVar5->iPrev = pNVar4->Id;
            }
          }
          else {
            piVar9 = piVar2;
            if (iVar10 < 0x10) {
              piVar9 = p->pLists2 + iVar10;
            }
            iVar10 = *piVar9;
            if (iVar10 != 0) {
              ppNVar14 = p->pVerts;
              goto LAB_004e2817;
            }
          }
          *piVar9 = pNVar4->Id;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pNext->nEdges);
  }
  iVar10 = pVertex->Id;
  iVar3 = pNext->Id;
  iVar11 = iVar3;
  if (iVar10 < iVar3) {
    iVar11 = iVar10;
  }
  if (iVar10 < iVar3) {
    pVertex = pNext;
  }
  Vec_IntPush(p->vPairs,p->pMapId2Lut[iVar11]);
  Vec_IntPush(p->vPairs,p->pMapId2Lut[pVertex->Id]);
  return;
}

Assistant:

void Nwk_ManGraphUpdate( Nwk_Grf_t * p, Nwk_Vrt_t * pVertex, Nwk_Vrt_t * pNext )
{
    Nwk_Vrt_t * pChanged, * pOther;
    int i, k;
//    Nwk_ManGraphCheckLists( p );
    Nwk_ManGraphListExtract( p, pVertex );
    Nwk_ManGraphListExtract( p, pNext );
    // update neihbors of pVertex
    Nwk_VertexForEachAdjacent( p, pVertex, pChanged, i )
    {
        if ( pChanged == pNext )
            continue;
        Nwk_ManGraphListExtract( p, pChanged );
        // move those that use this one
        if ( pChanged->nEdges > 1 )
        Nwk_VertexForEachAdjacent( p, pChanged, pOther, k )
        {
            if ( pOther == pVertex || pOther->nEdges > 1 )
                continue;
            assert( pOther->nEdges == 1 );
            Nwk_ManGraphListExtract( p, pOther );
            pChanged->nEdges--;
            Nwk_ManGraphListInsert( p, pOther );
            pChanged->nEdges++;
        }
        // remove the edge
        Nwk_ManGraphVertexRemoveEdge( pChanged, pVertex );
        // add the changed vertex back
        if ( pChanged->nEdges > 0 )
            Nwk_ManGraphListInsert( p, pChanged );
    }
    // update neihbors of pNext
    Nwk_VertexForEachAdjacent( p, pNext, pChanged, i )
    {
        if ( pChanged == pVertex )
            continue;
        Nwk_ManGraphListExtract( p, pChanged );
        // move those that use this one
        if ( pChanged->nEdges > 1 )
        Nwk_VertexForEachAdjacent( p, pChanged, pOther, k )
        {
            if ( pOther == pNext || pOther->nEdges > 1 )
                continue;
            assert( pOther->nEdges == 1 );
            Nwk_ManGraphListExtract( p, pOther );
            pChanged->nEdges--;
            Nwk_ManGraphListInsert( p, pOther );
            pChanged->nEdges++;
        }
        // remove the edge
        Nwk_ManGraphVertexRemoveEdge( pChanged, pNext );
        // add the changed vertex back
        if ( pChanged->nEdges > 0 )
            Nwk_ManGraphListInsert( p, pChanged );
    }
    // add to the result
    if ( pVertex->Id < pNext->Id )
    {
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pVertex->Id] ); 
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pNext->Id] ); 
    }
    else
    {
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pNext->Id] ); 
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pVertex->Id] ); 
    }
//    Nwk_ManGraphCheckLists( p );
}